

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O1

leb_Node leb_DecodeNode(leb_Heap *leb,uint32_t nodeID)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  leb_Node lVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  
  lVar5.id = 1;
  lVar5.depth = 0;
  uVar2 = leb__HeapRead(leb,(leb_Node)0x1);
  if (nodeID < uVar2) {
    uVar2 = leb__HeapRead(leb,(leb_Node)0x1);
    if (1 < uVar2) {
      uVar7 = 1;
      lVar6 = 0;
      do {
        uVar8 = nodeID;
        lVar6 = lVar6 + 0x100000000;
        iVar1 = (int)uVar7;
        uVar3 = leb__HeapRead(leb,(leb_Node)((ulong)(uint)(iVar1 * 2) + lVar6));
        uVar7 = (ulong)((uint)(uVar3 <= uVar8) + iVar1 * 2);
        uVar2 = 0;
        if (uVar3 <= uVar8) {
          uVar2 = uVar3;
        }
        uVar4 = leb__HeapRead(leb,(leb_Node)(lVar6 + uVar7));
        nodeID = uVar8 - uVar2;
      } while (1 < uVar4);
      lVar5 = (leb_Node)((ulong)((uint)(uVar3 <= uVar8) + iVar1 * 2) + lVar6);
    }
    return lVar5;
  }
  __assert_fail("nodeID < leb_NodeCount(leb) && \"nodeID > NodeCount(leb)\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/LongestEdgeBisection/LongestEdgeBisection.h"
                ,0x300,"leb_Node leb_DecodeNode(const leb_Heap *, uint32_t)");
}

Assistant:

LEBDEF leb_Node leb_DecodeNode(const leb_Heap *leb, uint32_t nodeID)
{
    LEB_ASSERT(nodeID < leb_NodeCount(leb) && "nodeID > NodeCount(leb)");

    leb_Node node = {1u, 0};

    while (leb__HeapRead(leb, node) > 1u) {
        uint32_t cmp = leb__HeapRead(leb, {node.id<<= 1u, ++node.depth});
        uint32_t b = nodeID < cmp ? 0 : 1;

        node.id|= b;
        nodeID-= cmp * b;
    }

    return node;
}